

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_sigproc.c
# Opt level: O0

void fe_dct3(fe_t *fe,mfcc_t *mfcep,powspec_t *mflogspec)

{
  int local_28;
  int local_24;
  int32 j;
  int32 i;
  powspec_t *mflogspec_local;
  mfcc_t *mfcep_local;
  fe_t *fe_local;
  
  for (local_24 = 0; local_24 < fe->mel_fb->num_filters; local_24 = local_24 + 1) {
    mflogspec[local_24] = (powspec_t)((double)(float)*mfcep * 0.707106781186548);
    for (local_28 = 1; local_28 < (int)(uint)fe->num_cepstra; local_28 = local_28 + 1) {
      mflogspec[local_24] =
           (powspec_t)
           ((double)((float)mfcep[local_28] * (float)fe->mel_fb->mel_cosine[local_28][local_24]) +
           (double)mflogspec[local_24]);
    }
    mflogspec[local_24] =
         (powspec_t)((double)mflogspec[local_24] * (double)(float)fe->mel_fb->sqrt_inv_2n);
  }
  return;
}

Assistant:

void
fe_dct3(fe_t * fe, const mfcc_t * mfcep, powspec_t * mflogspec)
{
    int32 i, j;

    for (i = 0; i < fe->mel_fb->num_filters; ++i) {
        mflogspec[i] = COSMUL(mfcep[0], SQRT_HALF);
        for (j = 1; j < fe->num_cepstra; j++) {
            mflogspec[i] += COSMUL(mfcep[j], fe->mel_fb->mel_cosine[j][i]);
        }
        mflogspec[i] = COSMUL(mflogspec[i], fe->mel_fb->sqrt_inv_2n);
    }
}